

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O1

bool tokens_to_json(char *file_name,Lexer *lexer)

{
  string s;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  get_tokens_as_string(lexer,&local_30);
  append_content(file_name,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool tokens_to_json(const char * file_name, Lexer & lexer)
{
  string s;
  if (!get_tokens_as_string(lexer, s))
    return false;

  append_content(file_name, s);
  return true;
}